

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>>,fmt::v8::detail::error_handler>
              (void)

{
  ulong in_stack_00000008;
  long in_stack_00000010;
  undefined4 in_stack_00000018;
  error_handler local_9;
  width_checker<fmt::v8::detail::error_handler> local_8;
  
  local_8.handler_ = &local_9;
  switch(in_stack_00000018) {
  case 1:
    in_stack_00000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<int,_0>
                   (&local_8,(int)in_stack_00000008);
    break;
  case 2:
    in_stack_00000008 = in_stack_00000008 & 0xffffffff;
    break;
  case 3:
    in_stack_00000008 =
         width_checker<fmt::v8::detail::error_handler>::operator()<long_long,_0>
                   (&local_8,in_stack_00000008);
    break;
  case 5:
    if (in_stack_00000010 < 0) {
      fmt::v8::detail::throw_format_error("negative width");
    }
  case 4:
  case 6:
    break;
  default:
    fmt::v8::detail::throw_format_error("width is not integer");
  case 8:
    in_stack_00000008 = in_stack_00000008 & 0xffff;
    goto LAB_0019747c;
  }
  if (in_stack_00000008 >> 0x1f != 0) {
    fmt::v8::detail::throw_format_error("number is too big");
  }
LAB_0019747c:
  return (int)in_stack_00000008;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}